

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryContextTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GetCurrentContextCase::executeForContext
          (GetCurrentContextCase *this,EGLDisplay display,EGLContext context,EGLSurface surface,
          Config *config)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  deUint32 err;
  Library *pLVar2;
  Hex<16UL> hex;
  char *description;
  TestContext *this_01;
  undefined1 local_1a8 [384];
  
  pLVar2 = EglTestContext::getLibrary
                     ((this->super_SingleContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                      super_TestCase.m_eglTestCtx);
  pTVar1 = ((this->super_SingleContextRenderCase).super_RenderCase.super_SimpleConfigCase.
            super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  (this->super_CallLogWrapper).m_enableLog = true;
  hex.value = (deUint64)eglu::CallLogWrapper::eglGetCurrentContext(&this->super_CallLogWrapper);
  err = (*pLVar2->_vptr_Library[0x1f])(pLVar2);
  eglu::checkError(err,"eglGetCurrentContext",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglQueryContextTests.cpp"
                   ,0x6b);
  this_00 = (ostringstream *)(local_1a8 + 8);
  local_1a8._0_8_ = pTVar1;
  if ((EGLContext)hex.value == context) {
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"  Pass");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  else {
    if (hex.value == 0) {
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"  Fail, got EGL_NO_CONTEXT");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      this_01 = (this->super_SingleContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                super_TestCase.super_TestCase.super_TestNode.m_testCtx;
      description = "Unexpected EGL_NO_CONTEXT";
    }
    else {
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"  Fail, call returned the wrong context. Expected: ");
      tcu::Format::operator<<((ostream *)this_00,(Hex<16UL>)context);
      std::operator<<((ostream *)this_00,", got: ");
      tcu::Format::operator<<((ostream *)this_00,hex);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      this_01 = (this->super_SingleContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                super_TestCase.super_TestCase.super_TestNode.m_testCtx;
      description = "Invalid context";
    }
    tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_FAIL,description);
  }
  (this->super_CallLogWrapper).m_enableLog = false;
  return;
}

Assistant:

void executeForContext (EGLDisplay display, EGLContext context, EGLSurface surface, const Config& config)
	{
		const Library&	egl	= m_eglTestCtx.getLibrary();
		TestLog&		log	= m_testCtx.getLog();

		DE_UNREF(display);
		DE_UNREF(surface);
		DE_UNREF(config);

		enableLogging(true);

		const EGLContext	gotContext	= eglGetCurrentContext();
		EGLU_CHECK_MSG(egl, "eglGetCurrentContext");

		if (gotContext == context)
		{
			log << TestLog::Message << "  Pass" << TestLog::EndMessage;
		}
		else if (gotContext == EGL_NO_CONTEXT)
		{
			log << TestLog::Message << "  Fail, got EGL_NO_CONTEXT" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Unexpected EGL_NO_CONTEXT");
		}
		else if (gotContext != context)
		{
			log << TestLog::Message << "  Fail, call returned the wrong context. Expected: " << tcu::toHex(context) << ", got: " << tcu::toHex(gotContext) << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid context");
		}

		enableLogging(false);
	}